

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

void __thiscall CWire::ClearSegmentList(CWire *this)

{
  int iVar1;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *this_00;
  size_type sVar2;
  reference ppCVar3;
  int local_24;
  int s;
  int j;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList;
  int i;
  int iNumSegmentList;
  CWire *this_local;
  
  iVar1 = GetNumSegmentList(this);
  for (pSegmentList._0_4_ = 0; (int)pSegmentList < iVar1; pSegmentList._0_4_ = (int)pSegmentList + 1
      ) {
    this_00 = GetSegmentList(this,(int)pSegmentList);
    local_24 = 0;
    sVar2 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::size(this_00);
    for (; local_24 < (int)sVar2; local_24 = local_24 + 1) {
      ppCVar3 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::operator[]
                          (this_00,(long)local_24);
      CSegment::Delete(*ppCVar3);
    }
    std::vector<CSegment_*,_std::allocator<CSegment_*>_>::clear(this_00);
  }
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
  ::clear(&this->m_SegmentList);
  this->m_pRoutedSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
  return;
}

Assistant:

void CWire::ClearSegmentList()
{
	int	iNumSegmentList	=	GetNumSegmentList();

	for (int i=0;i<iNumSegmentList;++i)
	{
		vector<CSegment*>*	pSegmentList	=	GetSegmentList(i);
		for (int j=0,s=pSegmentList->size();j<s;++j)
		{
			(*pSegmentList)[j]->Delete();//SAFE_DEL((*pSegmentList)[j]);
		}

		pSegmentList->clear();
	}

	m_SegmentList.clear();
	m_pRoutedSegmentList	=	NULL;
}